

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void kj::Arena::destroyObject<capnp::compiler::NodeTranslator::StructLayout::Group>(void *pointer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *(long *)((long)pointer + 0x10);
  if (lVar1 != 0) {
    lVar2 = *(long *)((long)pointer + 0x18);
    lVar3 = *(long *)((long)pointer + 0x20);
    *(undefined8 *)((long)pointer + 0x10) = 0;
    *(undefined8 *)((long)pointer + 0x18) = 0;
    *(undefined8 *)((long)pointer + 0x20) = 0;
    (**(code **)**(undefined8 **)((long)pointer + 0x28))
              (*(undefined8 **)((long)pointer + 0x28),lVar1,8,lVar2 - lVar1 >> 3,lVar3 - lVar1 >> 3,
               0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }